

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.cpp
# Opt level: O0

void writeTrailer(DescriptorWrapper *fd)

{
  void *buf;
  undefined1 local_65 [8];
  char additionalNullTerminator;
  allocator<char> local_51;
  string local_50 [8];
  string trailerFilename;
  header_old_cpio header;
  DescriptorWrapper *fd_local;
  
  trailerFilename.field_2._14_2_ = 0x71c7;
  DescriptorWrapper::writeFrom(fd,(void *)((long)&trailerFilename.field_2 + 0xe),0x1a);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_50,"TRAILER!!!",&local_51);
  std::allocator<char>::~allocator(&local_51);
  local_65[0] = 0;
  buf = (void *)std::__cxx11::string::c_str();
  DescriptorWrapper::writeFrom(fd,buf,0xb);
  DescriptorWrapper::writeFrom(fd,local_65,1);
  std::__cxx11::string::~string(local_50);
  return;
}

Assistant:

void writeTrailer(DescriptorWrapper fd)
{
	header_old_cpio header;
	header.c_magic = 0x71c7;
	header.c_dev = 0;
	header.c_ino = 0;
	header.c_mode = 0;
	header.c_uid = 0;
	header.c_gid = 0;
	header.c_nlink = 1;
	header.c_rdev = 0;
	header.c_mtime[0] = 0;
	header.c_mtime[1] = 0;
	header.c_namesize = 11;
	header.c_filesize[0] = 0;
	header.c_filesize[1] = 0;

	fd.writeFrom(&header, sizeof(header_old_cpio));
	string trailerFilename("TRAILER!!!");
	char additionalNullTerminator = 0;
	fd.writeFrom((void*)trailerFilename.c_str(), header.c_namesize);
	if (header.c_namesize % 2 == 1)
		fd.writeFrom(&additionalNullTerminator, 1);
}